

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

void Fra_ClausWriteIndClauses(Clu_Man_t *p)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uint uVar3;
  Cnf_Dat_t *pCVar4;
  int *piVar5;
  int *pVar2Id;
  long lVar6;
  Aig_Man_t *pAVar7;
  Vec_Int_t *pVVar8;
  Aig_Obj_t *p0;
  Aig_Obj_t *p1;
  char *pFileName;
  long lVar9;
  uint uVar10;
  
  pCVar4 = p->pCnf;
  iVar1 = pCVar4->nVars;
  __size = (long)iVar1 * 4;
  pVar2Id = (int *)malloc(__size);
  memset(pVar2Id,0xff,__size);
  pAVar7 = p->pAig;
  lVar6 = (long)pAVar7->vObjs->nSize;
  if (0 < lVar6) {
    piVar5 = pCVar4->pVarNums;
    lVar9 = 0;
    do {
      iVar2 = piVar5[lVar9];
      if (-1 < (long)iVar2) {
        if (iVar1 <= iVar2) {
          __assert_fail("p->pCnf->pVarNums[i] < p->pCnf->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x612,"void Fra_ClausWriteIndClauses(Clu_Man_t *)");
        }
        pVar2Id[iVar2] = (int)lVar9;
      }
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  pAVar7 = Aig_ManDupWithoutPos(pAVar7);
  pVVar8 = p->vClausesProven;
  if (0 < pVVar8->nSize) {
    piVar5 = p->vLitsProven->pArray;
    lVar6 = 0;
    uVar10 = 0;
    do {
      uVar3 = pVVar8->pArray[lVar6];
      p0 = Fra_ClausGetLiteral(p,pVar2Id,piVar5[(int)uVar10]);
      if ((int)(uVar10 + 1) < (int)uVar3) {
        lVar9 = 0;
        do {
          p1 = Fra_ClausGetLiteral(p,pVar2Id,piVar5[(int)(uVar10 + 1) + lVar9]);
          p0 = Aig_Or(pAVar7,p0,p1);
          lVar9 = lVar9 + 1;
        } while (~uVar10 + uVar3 != (int)lVar9);
      }
      Aig_ObjCreateCo(pAVar7,p0);
      lVar6 = lVar6 + 1;
      pVVar8 = p->vClausesProven;
      uVar10 = uVar3;
    } while (lVar6 < pVVar8->nSize);
  }
  if (pVar2Id != (int *)0x0) {
    free(pVar2Id);
  }
  Aig_ManCleanup(pAVar7);
  pFileName = Ioa_FileNameGenericAppend(p->pAig->pName,"_care.aig");
  printf("Care one-hotness clauses will be written into file \"%s\".\n",pFileName);
  Ioa_WriteAiger(pAVar7,pFileName,0,1);
  Aig_ManStop(pAVar7);
  return;
}

Assistant:

void Fra_ClausWriteIndClauses( Clu_Man_t * p )
{ 
    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );
    Aig_Man_t * pNew;
    Aig_Obj_t * pClause, * pLiteral;
    char * pName;
    int * pStart, * pVar2Id; 
    int Beg, End, i, k;
    // create mapping from SAT vars to node IDs
    pVar2Id = ABC_ALLOC( int, p->pCnf->nVars );
    memset( pVar2Id, 0xFF, sizeof(int) * p->pCnf->nVars );
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        if ( p->pCnf->pVarNums[i] >= 0 )
        {
            assert( p->pCnf->pVarNums[i] < p->pCnf->nVars );
            pVar2Id[ p->pCnf->pVarNums[i] ] = i;
        }
    // start the manager
    pNew = Aig_ManDupWithoutPos( p->pAig );
    // add the clauses
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        pClause = Fra_ClausGetLiteral( p, pVar2Id, pStart[Beg] );
        for ( k = Beg + 1; k < End; k++ )
        {
            pLiteral = Fra_ClausGetLiteral( p, pVar2Id, pStart[k] );
            pClause = Aig_Or( pNew, pClause, pLiteral );
        }
        Aig_ObjCreateCo( pNew, pClause );
        Beg = End;
    }
    ABC_FREE( pVar2Id );
    Aig_ManCleanup( pNew );
    pName = Ioa_FileNameGenericAppend( p->pAig->pName, "_care.aig" );
    printf( "Care one-hotness clauses will be written into file \"%s\".\n", pName );
    Ioa_WriteAiger( pNew, pName, 0, 1 );
    Aig_ManStop( pNew );
}